

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

string * __thiscall adios2::IO::Name_abi_cxx11_(IO *this)

{
  long *in_RSI;
  string *in_RDI;
  string *in_stack_00000048;
  IO *in_stack_00000050;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to IO::InConfigFile",&local_31);
  helper::CheckForNullptr<adios2::core::IO>(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(in_RDI,(string *)(*in_RSI + 0x18));
  return in_RDI;
}

Assistant:

std::string IO::Name() const
{
    helper::CheckForNullptr(m_IO, "in call to IO::InConfigFile");
    return m_IO->m_Name;
}